

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
amrex::DistributionMapping::getOwnerShip(DistributionMapping *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Long LVar4;
  int *piVar5;
  element_type *peVar6;
  Vector<int,_std::allocator<int>_> *in_RDI;
  int rank;
  int N;
  int i;
  int myProc;
  bool in_stack_0000003f;
  vector<bool,_std::allocator<bool>_> *in_stack_00000040;
  size_type in_stack_ffffffffffffffd8;
  int iVar7;
  int iVar8;
  
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x11faf18);
  bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                    ((vector<bool,_std::allocator<bool>_> *)this);
  if (bVar1) {
    iVar2 = ParallelDescriptor::MyProc();
    iVar8 = 0;
    std::
    __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x11faf48);
    LVar4 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x11faf50);
    iVar3 = (int)LVar4;
    for (; iVar8 < iVar3; iVar8 = iVar8 + 1) {
      std::
      __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x11faf6c);
      piVar5 = Vector<int,_std::allocator<int>_>::operator[](in_RDI,in_stack_ffffffffffffffd8);
      iVar7 = *piVar5;
      bVar1 = ParallelDescriptor::sameTeam(0);
      if (bVar1) {
        std::
        __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x11faf98);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,iVar8),
                   (value_type *)CONCAT44(iVar3,iVar7));
        std::
        __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x11fafb3);
        std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_00000040,in_stack_0000003f);
      }
    }
  }
  peVar6 = std::
           __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11fafee);
  return &peVar6->m_ownership;
}

Assistant:

const std::vector<bool>&
DistributionMapping::getOwnerShip ()
{
    if (m_ref->m_ownership.empty())
    {
        int myProc = ParallelDescriptor::MyProc();

        for(int i = 0, N = m_ref->m_pmap.size(); i < N; ++i) {
            int rank = m_ref->m_pmap[i];
            if (ParallelDescriptor::sameTeam(rank)) {
                // If Team is not used (i.e., team size == 1), distributionMap[i] == myProc
                m_ref->m_index_array.push_back(i);
                m_ref->m_ownership.push_back(myProc == rank);
            }
        }
    }
    return m_ref->m_ownership;
}